

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O2

void __thiscall tcu::CaseTreeNode::~CaseTreeNode(CaseTreeNode *this)

{
  CaseTreeNode *this_00;
  pointer ppCVar1;
  
  for (ppCVar1 = (this->m_children).
                 super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppCVar1 !=
      (this->m_children).
      super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppCVar1 = ppCVar1 + 1) {
    this_00 = *ppCVar1;
    if (this_00 != (CaseTreeNode *)0x0) {
      ~CaseTreeNode(this_00);
    }
    operator_delete(this_00,0x38);
  }
  std::_Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::~_Vector_base
            (&(this->m_children).
              super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

CaseTreeNode::~CaseTreeNode (void)
{
	for (vector<CaseTreeNode*>::const_iterator i = m_children.begin(); i != m_children.end(); ++i)
		delete *i;
}